

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EnsureYield(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  ulong uVar1;
  undefined4 uVar2;
  ulong uVar3;
  EmitInfo dst;
  uint32 index;
  PolymorphicEmitInfo PVar4;
  undefined1 auStack_38 [8];
  PolymorphicEmitInfo yieldEmitInfo;
  
  yieldEmitInfo.count = 0;
  yieldEmitInfo._4_4_ = 0;
  uVar3 = 0;
  if ((blockInfo->yieldInfo).count != 0) {
    uVar1 = *(ulong *)&blockInfo->yieldInfo;
    yieldEmitInfo._0_8_ = (blockInfo->yieldInfo).field_1;
    auStack_38._0_4_ = (undefined4)uVar1;
    uVar2 = auStack_38._0_4_;
    if (blockInfo->didYield == false) {
      blockInfo->didYield = true;
      if (auStack_38._0_4_ == 0) goto LAB_00f22323;
      index = 0;
      auStack_38 = (undefined1  [8])uVar1;
      do {
        dst = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)auStack_38,index);
        EmitLoadConst(this,dst,(WasmConstLitNode)ZEXT816(0));
        index = index + 1;
      } while (uVar2 != index);
    }
    uVar3 = uVar1 & 0xffffffff;
  }
LAB_00f22323:
  PVar4.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)yieldEmitInfo._0_8_;
  PVar4._0_8_ = uVar3;
  return PVar4;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EnsureYield(BlockInfo* blockInfo)
{
    PolymorphicEmitInfo yieldEmitInfo;
    if (blockInfo->HasYield())
    {
        yieldEmitInfo = blockInfo->yieldInfo;
        if (!blockInfo->DidYield())
        {
            // Emit a load to the yield location to make sure we have a dest there
            // Most likely we can't reach this code so the value doesn't matter
            blockInfo->didYield = true;
            for (uint32 i = 0; i < yieldEmitInfo.Count(); ++i)
            {
                EmitLoadConst(yieldEmitInfo.GetInfo(i), GetZeroCnst());
            }
        }
    }
    return yieldEmitInfo;
}